

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O0

void __thiscall
TPZDohrPrecondV2SubData<double,_TPZDohrSubstruct<double>_>::TPZDohrPrecondV2SubData
          (TPZDohrPrecondV2SubData<double,_TPZDohrSubstruct<double>_> *this,int subindex,
          TPZAutoPointer<TPZDohrSubstruct<double>_> *substruct,
          TPZAutoPointer<TPZFMatrix<double>_> *res_local)

{
  TPZFMatrix<double> *this_00;
  TPZAutoPointer<TPZFMatrix<double>_> *in_RCX;
  undefined4 in_ESI;
  TPZAutoPointer<TPZDohrAssembleItem<double>_> *in_RDI;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  TPZAutoPointer<TPZDohrAssembleItem<double>_> *in_stack_ffffffffffffffa0;
  TPZDohrAssembleItem<double> *rval;
  
  TPZAutoPointer<TPZDohrSubstruct<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrSubstruct<double>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (TPZAutoPointer<TPZDohrSubstruct<double>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  TPZAutoPointer<TPZFMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZFMatrix<double>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (TPZAutoPointer<TPZFMatrix<double>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  rval = (TPZDohrAssembleItem<double> *)(in_RDI + 2);
  TPZAutoPointer<TPZDohrAssembleItem<double>_>::TPZAutoPointer(in_stack_ffffffffffffffa0);
  operator_new(0x98);
  this_00 = TPZAutoPointer<TPZFMatrix<double>_>::operator->(in_RCX);
  TPZBaseMatrix::Rows((TPZBaseMatrix *)this_00);
  TPZDohrAssembleItem<double>::TPZDohrAssembleItem
            ((TPZDohrAssembleItem<double> *)CONCAT44(in_ESI,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  TPZAutoPointer<TPZDohrAssembleItem<double>_>::operator=(in_RDI,rval);
  return;
}

Assistant:

TPZDohrPrecondV2SubData(int subindex, const TPZAutoPointer<TSubStruct> &substruct, TPZAutoPointer<TPZFMatrix<TVar> > res_local) : fSubStructure(substruct),
	fInput_local(res_local)
	{
		fv2_local = new TPZDohrAssembleItem<TVar>(subindex, res_local->Rows());
	}